

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ast.cpp
# Opt level: O1

void __thiscall PrintAST::visit(PrintAST *this,CaseBlockNode *node)

{
  TokenNode *pTVar1;
  StmtListNode *pSVar2;
  CaseBlockNode *pCVar3;
  
  printAST(this,"CASE_BLOCK");
  this->level = this->level + 1;
  pTVar1 = node->num;
  if (pTVar1 != (TokenNode *)0x0) {
    (*(pTVar1->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar1,this);
  }
  pSVar2 = node->stmt;
  if (pSVar2 != (StmtListNode *)0x0) {
    (*(pSVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pSVar2,this);
  }
  pCVar3 = node->next;
  if (pCVar3 != (CaseBlockNode *)0x0) {
    (*(pCVar3->super_ASTNode)._vptr_ASTNode[3])(pCVar3,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintAST::visit(CaseBlockNode *node) {
    this->printAST("CASE_BLOCK");
    up_level();
    if (node->getNum() != nullptr) {
        node->getNum()->accept(this);
    }
    if (node->getStmt() != nullptr) {
        node->getStmt()->accept(this);
    }
    if (node->getNext() != nullptr) {
        node->getNext()->accept(this);
    }
    down_level();
}